

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

UBool compareBinaryFiles(char *defaultTZFileName,char *TZFileName,DefaultTZInfo *tzInfo)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  int local_258;
  UBool local_249;
  undefined1 local_248 [7];
  UBool result;
  char bufferFile [512];
  int32_t sizeFileToRead;
  int32_t sizeFileRead;
  int64_t sizeFileLeft;
  int64_t sizeFile;
  FILE *file;
  DefaultTZInfo *tzInfo_local;
  char *TZFileName_local;
  char *defaultTZFileName_local;
  
  local_249 = '\x01';
  if (tzInfo->defaultTZFilePtr == (FILE *)0x0) {
    pFVar3 = fopen(defaultTZFileName,"r");
    tzInfo->defaultTZFilePtr = (FILE *)pFVar3;
  }
  pFVar3 = fopen(TZFileName,"r");
  tzInfo->defaultTZPosition = 0;
  if ((pFVar3 == (FILE *)0x0) || (tzInfo->defaultTZFilePtr == (FILE *)0x0)) {
    local_249 = '\0';
  }
  else {
    if (tzInfo->defaultTZFileSize == 0) {
      fseek((FILE *)tzInfo->defaultTZFilePtr,0,2);
      lVar4 = ftell((FILE *)tzInfo->defaultTZFilePtr);
      tzInfo->defaultTZFileSize = lVar4;
    }
    fseek(pFVar3,0,2);
    _sizeFileToRead = ftell(pFVar3);
    if (_sizeFileToRead == tzInfo->defaultTZFileSize) {
      if (tzInfo->defaultTZBuffer == (char *)0x0) {
        rewind((FILE *)tzInfo->defaultTZFilePtr);
        pcVar5 = (char *)uprv_malloc_63(tzInfo->defaultTZFileSize);
        tzInfo->defaultTZBuffer = pcVar5;
        fread(tzInfo->defaultTZBuffer,1,tzInfo->defaultTZFileSize,(FILE *)tzInfo->defaultTZFilePtr);
      }
      rewind(pFVar3);
      while (0 < _sizeFileToRead) {
        memset(local_248,0,0x200);
        if (_sizeFileToRead < 0x200) {
          local_258 = (int)_sizeFileToRead;
        }
        else {
          local_258 = 0x200;
        }
        sVar6 = fread(local_248,1,(long)local_258,pFVar3);
        iVar1 = (int)sVar6;
        iVar2 = memcmp(tzInfo->defaultTZBuffer + tzInfo->defaultTZPosition,local_248,(long)iVar1);
        if (iVar2 != 0) {
          local_249 = '\0';
          break;
        }
        _sizeFileToRead = _sizeFileToRead - iVar1;
        tzInfo->defaultTZPosition = iVar1 + tzInfo->defaultTZPosition;
      }
    }
    else {
      local_249 = '\0';
    }
  }
  if (pFVar3 != (FILE *)0x0) {
    fclose(pFVar3);
  }
  return local_249;
}

Assistant:

static UBool compareBinaryFiles(const char* defaultTZFileName, const char* TZFileName, DefaultTZInfo* tzInfo) {
    FILE* file; 
    int64_t sizeFile;
    int64_t sizeFileLeft;
    int32_t sizeFileRead;
    int32_t sizeFileToRead;
    char bufferFile[MAX_READ_SIZE];
    UBool result = TRUE;

    if (tzInfo->defaultTZFilePtr == NULL) {
        tzInfo->defaultTZFilePtr = fopen(defaultTZFileName, "r");
    }
    file = fopen(TZFileName, "r");

    tzInfo->defaultTZPosition = 0; /* reset position to begin search */

    if (file != NULL && tzInfo->defaultTZFilePtr != NULL) {
        /* First check that the file size are equal. */
        if (tzInfo->defaultTZFileSize == 0) {
            fseek(tzInfo->defaultTZFilePtr, 0, SEEK_END);
            tzInfo->defaultTZFileSize = ftell(tzInfo->defaultTZFilePtr);
        }
        fseek(file, 0, SEEK_END);
        sizeFile = ftell(file);
        sizeFileLeft = sizeFile;

        if (sizeFile != tzInfo->defaultTZFileSize) {
            result = FALSE;
        } else {
            /* Store the data from the files in seperate buffers and
             * compare each byte to determine equality.
             */
            if (tzInfo->defaultTZBuffer == NULL) {
                rewind(tzInfo->defaultTZFilePtr);
                tzInfo->defaultTZBuffer = (char*)uprv_malloc(sizeof(char) * tzInfo->defaultTZFileSize);
                sizeFileRead = fread(tzInfo->defaultTZBuffer, 1, tzInfo->defaultTZFileSize, tzInfo->defaultTZFilePtr);
            }
            rewind(file);
            while(sizeFileLeft > 0) {
                uprv_memset(bufferFile, 0, MAX_READ_SIZE);
                sizeFileToRead = sizeFileLeft < MAX_READ_SIZE ? sizeFileLeft : MAX_READ_SIZE;

                sizeFileRead = fread(bufferFile, 1, sizeFileToRead, file);
                if (memcmp(tzInfo->defaultTZBuffer + tzInfo->defaultTZPosition, bufferFile, sizeFileRead) != 0) {
                    result = FALSE;
                    break;
                }
                sizeFileLeft -= sizeFileRead;
                tzInfo->defaultTZPosition += sizeFileRead;
            }
        }
    } else {
        result = FALSE;
    }

    if (file != NULL) {
        fclose(file);
    }

    return result;
}